

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.h
# Opt level: O0

void __thiscall
wabt::TypeChecker::PrintStackIfFailed<wabt::Type,wabt::Type>
          (TypeChecker *this,Result result,char *desc,Type args,Type args_1)

{
  initializer_list<wabt::Type> __l;
  char *desc_00;
  bool bVar1;
  allocator<wabt::Type> local_61;
  Type local_60;
  Type local_5c;
  iterator local_58;
  size_type local_50;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_48;
  Result local_30;
  Enum local_2c;
  Type local_28;
  Type local_24;
  Type args_local_1;
  Type args_local;
  char *desc_local;
  TypeChecker *this_local;
  Result result_local;
  
  local_2c = result.enum_;
  local_28 = args_1;
  local_24 = args;
  _args_local_1 = desc;
  desc_local = (char *)this;
  this_local._4_4_ = result.enum_;
  bVar1 = Failed(result);
  desc_00 = _args_local_1;
  if (bVar1) {
    local_30.enum_ = this_local._4_4_;
    local_60 = local_24;
    local_5c = local_28;
    local_58 = &local_60;
    local_50 = 2;
    std::allocator<wabt::Type>::allocator(&local_61);
    __l._M_len = local_50;
    __l._M_array = local_58;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_48,__l,&local_61);
    PrintStackIfFailed(this,local_30,desc_00,&local_48);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_48);
    std::allocator<wabt::Type>::~allocator(&local_61);
  }
  return;
}

Assistant:

void PrintStackIfFailed(Result result, const char* desc, Args... args) {
    // Minor optimzation, check result before constructing the vector to pass
    // to the other overload of PrintStackIfFailed.
    if (Failed(result)) {
      PrintStackIfFailed(result, desc, {args...});
    }
  }